

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void do_split(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  CHAR_DATA *in_RDI;
  CHAR_DATA *gch_1;
  char buf [4608];
  int extra_gold;
  int share_gold;
  CHAR_DATA *gch;
  int members;
  int amount_gold;
  char arg1 [4608];
  char *in_stack_ffffffffffffdbb8;
  char *in_stack_ffffffffffffdbc0;
  CHAR_DATA *ach;
  CHAR_DATA *in_stack_ffffffffffffdbc8;
  char *in_stack_ffffffffffffdbd0;
  CHAR_DATA *local_1228;
  int local_1220;
  char local_1218 [4624];
  CHAR_DATA *local_8;
  
  local_8 = in_RDI;
  one_argument(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
  if (local_1218[0] == '\0') {
    send_to_char(in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8);
  }
  else {
    uVar2 = atoi(local_1218);
    if ((int)uVar2 < 0) {
      send_to_char(in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8);
    }
    else if (uVar2 == 0) {
      send_to_char(in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8);
    }
    else if (local_8->gold < (long)(int)uVar2) {
      send_to_char(in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8);
    }
    else {
      local_1220 = 0;
      for (local_1228 = local_8->in_room->people; local_1228 != (CHAR_DATA *)0x0;
          local_1228 = local_1228->next_in_room) {
        bVar1 = is_same_group(local_1228,local_8);
        if ((bVar1) &&
           (bVar1 = is_affected_by(in_stack_ffffffffffffdbc8,
                                   (int)((ulong)in_stack_ffffffffffffdbc0 >> 0x20)), !bVar1)) {
          local_1220 = local_1220 + 1;
        }
      }
      if (local_1220 < 2) {
        send_to_char(in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8);
      }
      else {
        uVar3 = (int)uVar2 / local_1220;
        if (uVar3 == 0) {
          send_to_char(in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8);
        }
        else {
          local_8->gold = local_8->gold - (long)(int)uVar2;
          local_8->gold = (long)(int)(uVar3 + (int)uVar2 % local_1220) + local_8->gold;
          if (0 < (int)uVar3) {
            sprintf(&stack0xffffffffffffdbc8,"You split %d gold coins. Your share is %d gold.\n\r",
                    (ulong)uVar2,(ulong)(uVar3 + (int)uVar2 % local_1220));
            send_to_char(in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8);
          }
          sprintf(&stack0xffffffffffffdbc8,"$n splits %d gold coins. Your share is %d gold.",
                  (ulong)uVar2,(ulong)uVar3);
          for (ach = local_8->in_room->people; ach != (CHAR_DATA *)0x0; ach = ach->next_in_room) {
            if (((ach != local_8) && (bVar1 = is_same_group(ach,local_8), bVar1)) &&
               (bVar1 = is_affected_by(in_stack_ffffffffffffdbc8,(int)((ulong)ach >> 0x20)), !bVar1)
               ) {
              act(in_stack_ffffffffffffdbd0,in_stack_ffffffffffffdbc8,ach,in_stack_ffffffffffffdbb8,
                  0);
              ach->gold = (long)(int)uVar3 + ach->gold;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_split(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	one_argument(argument, arg1);

	if (arg1[0] == '\0')
	{
		send_to_char("Split how much?\n\r", ch);
		return;
	}

	auto amount_gold = atoi(arg1);
	if (amount_gold < 0)
	{
		send_to_char("Your group wouldn't like that.\n\r", ch);
		return;
	}

	if (amount_gold == 0)
	{
		send_to_char("You hand out zero coins, but no one notices.\n\r", ch);
		return;
	}

	if (ch->gold < amount_gold)
	{
		send_to_char("You don't have that much to split.\n\r", ch);
		return;
	}

	auto members = 0;
	for (auto gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (is_same_group(gch, ch) && !is_affected_by(gch, AFF_CHARM))
			members++;
	}

	if (members < 2)
	{
		send_to_char("Just keep it all.\n\r", ch);
		return;
	}

	auto share_gold = amount_gold / members;
	auto extra_gold = amount_gold % members;

	if (share_gold == 0)
	{
		send_to_char("Don't even bother, cheapskate.\n\r", ch);
		return;
	}

	ch->gold -= amount_gold;
	ch->gold += share_gold + extra_gold;

	char buf[MAX_STRING_LENGTH];
	if (share_gold > 0)
	{
		sprintf(buf, "You split %d gold coins. Your share is %d gold.\n\r", amount_gold, share_gold + extra_gold);
		send_to_char(buf, ch);
	}

	sprintf(buf, "$n splits %d gold coins. Your share is %d gold.", amount_gold, share_gold);

	for (auto gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (gch != ch && is_same_group(gch, ch) && !is_affected_by(gch, AFF_CHARM))
		{
			act(buf, ch, nullptr, gch, TO_VICT);
			gch->gold += share_gold;
		}
	}
}